

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::
emplace_back<slang::ast::PortSymbol::NetTypeRange>
          (SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *this,NetTypeRange *args)

{
  undefined4 uVar1;
  iterator pNVar2;
  NetTypeRange *args_local;
  SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *this_local;
  
  if (this->len == this->cap) {
    pNVar2 = end(this);
    this_local = (SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)
                 emplaceRealloc<slang::ast::PortSymbol::NetTypeRange>(this,pNVar2,args);
  }
  else {
    pNVar2 = end(this);
    pNVar2->netType = args->netType;
    uVar1 = *(undefined4 *)&args->field_0xc;
    pNVar2->width = args->width;
    *(undefined4 *)&pNVar2->field_0xc = uVar1;
    this->len = this->len + 1;
    this_local = (SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)back(this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }